

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_soft_max(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  float fVar3;
  undefined1 auVar4 [64];
  int iVar5;
  ggml_tensor *pgVar6;
  long lVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  long lVar10;
  int64_t iVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  void *pvVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined8 uVar28;
  uint uVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  void *pvVar36;
  long lVar37;
  void *pvVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  float *pfVar42;
  uint n;
  long lVar43;
  ulong uVar44;
  uint uVar45;
  long lVar46;
  float *x;
  ulong uVar47;
  bool bVar48;
  bool bVar49;
  ushort uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  float fVar59;
  float fVar60;
  ggml_float gVar61;
  undefined1 auVar62 [16];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var [60];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM7 [16];
  int np;
  __m512 vx;
  
  auVar62 = in_ZMM1._0_16_;
  pgVar6 = dst->src[0];
  if (pgVar6->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1290,"fatal error");
  }
  uVar45 = dst->op_params[0];
  lVar7 = pgVar6->ne[0];
  pgVar8 = dst->src[1];
  iVar5 = params->ith;
  iVar35 = params->nth;
  lVar9 = pgVar6->ne[1];
  fVar3 = (float)dst->op_params[1];
  lVar10 = pgVar6->ne[2];
  auVar51 = vcvtusi2sd_avx512f(auVar62,(int)lVar10);
  auVar52._0_8_ = log2(auVar51._0_8_);
  auVar52._8_56_ = extraout_var_00;
  auVar51 = vroundsd_avx(auVar52._0_16_,auVar52._0_16_,9);
  uVar33 = vcvttsd2usi_avx512f(auVar51);
  auVar51._8_4_ = 0x80000000;
  auVar51._0_8_ = 0x8000000080000000;
  auVar51._12_4_ = 0x80000000;
  auVar51 = vxorps_avx512vl(ZEXT416((uint)fVar3),auVar51);
  uVar33 = 1 << (uVar33 & 0x1f);
  auVar62 = vcvtusi2ss_avx512f(auVar62,uVar33);
  fVar59 = exp2f(auVar51._0_4_ / auVar62._0_4_);
  fVar60 = exp2f((fVar3 * -0.5) / auVar62._0_4_);
  iVar11 = pgVar6->ne[0];
  iVar34 = ggml_nrows(pgVar6);
  iVar35 = (iVar35 + -1 + iVar34) / iVar35;
  iVar40 = iVar35 * iVar5;
  iVar35 = iVar35 + iVar40;
  if (iVar34 <= iVar35) {
    iVar35 = iVar34;
  }
  if (pgVar8 == (ggml_tensor *)0x0) {
    bVar49 = false;
  }
  else {
    bVar49 = pgVar8->type == GGML_TYPE_F16;
  }
  if (iVar40 < iVar35) {
    n = (uint)iVar11;
    lVar43 = (long)(int)n;
    auVar52 = vbroadcastss_avx512f(ZEXT416(uVar45));
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar47 = (ulong)(n & 0x7fffffff);
    lVar46 = (long)iVar40;
    uVar45 = n & 0xffffffc0;
    lVar37 = (long)(int)uVar45;
    x = (float *)((lVar43 + 0x10) * (long)iVar5 * 4 + (long)params->wdata);
    if (lVar43 < lVar37 + 1) {
      lVar43 = lVar37 + 1;
    }
    auVar55 = vpbroadcastq_avx512f();
    uVar44 = (lVar43 - lVar37) + 0xfU & 0xfffffffffffffff0;
    auVar4 = vmovdqu64_avx512f(auVar55);
    do {
      auVar62 = SUB6416(ZEXT464(0x3f800000),0);
      if (0.0 < fVar3) {
        uVar29 = (uint)((lVar46 / lVar9) % lVar10);
        bVar48 = uVar29 < uVar33;
        uVar32 = (uVar29 - uVar33) * 2;
        if (bVar48) {
          uVar32 = uVar29;
        }
        auVar62 = vcvtusi2ss_avx512f(in_XMM7,uVar32 + 1);
        auVar53._0_4_ =
             powf((float)((uint)bVar48 * (int)fVar59 + (uint)!bVar48 * (int)fVar60),auVar62._0_4_);
        auVar53._4_60_ = extraout_var;
        auVar62 = auVar53._0_16_;
        auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar55 = vmovdqu64_avx512f(auVar4);
      }
      sVar12 = dst->nb[1];
      pvVar13 = dst->data;
      sVar14 = pgVar6->nb[1];
      pvVar15 = pgVar6->data;
      if (pgVar8 == (ggml_tensor *)0x0) {
        pvVar36 = (void *)0x0;
        pvVar38 = (void *)0x0;
      }
      else {
        lVar43 = (lVar46 % lVar9) * lVar7;
        pvVar36 = (void *)((long)pgVar8->data + lVar43 * 2);
        pvVar38 = (void *)((long)pgVar8->data + lVar43 * 4);
      }
      if (0 < (int)n) {
        uVar41 = 0;
        do {
          x[uVar41] = *(float *)((long)pvVar15 + uVar41 * 4 + sVar14 * lVar46);
          uVar41 = uVar41 + 1;
        } while (uVar47 != uVar41);
      }
      if (0 < (int)uVar45) {
        uVar41 = 0;
        pfVar42 = x;
        do {
          lVar43 = 0;
          do {
            auVar56 = vmulps_avx512f(auVar52,*(undefined1 (*) [64])((long)pfVar42 + lVar43));
            *(undefined1 (*) [64])((long)pfVar42 + lVar43) = auVar56;
            lVar43 = lVar43 + 0x40;
          } while (lVar43 != 0x100);
          uVar41 = uVar41 + 0x40;
          pfVar42 = pfVar42 + 0x40;
        } while (uVar41 < (n & 0xffffffc0));
      }
      if (uVar45 != n) {
        uVar41 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vporq_avx512f(auVar56,auVar53);
          auVar56 = vporq_avx512f(auVar56,auVar54);
          uVar28 = vpcmpuq_avx512f(auVar56,auVar55,2);
          bVar30 = (byte)uVar28;
          uVar28 = vpcmpuq_avx512f(auVar57,auVar55,2);
          bVar31 = (byte)uVar28;
          uVar50 = CONCAT11(bVar31,bVar30);
          pfVar42 = x + lVar37 + uVar41;
          auVar56._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * (int)pfVar42[1];
          auVar56._0_4_ = (uint)(bVar30 & 1) * (int)*pfVar42;
          auVar56._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * (int)pfVar42[2];
          auVar56._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * (int)pfVar42[3];
          auVar56._16_4_ = (uint)((byte)(uVar50 >> 4) & 1) * (int)pfVar42[4];
          auVar56._20_4_ = (uint)((byte)(uVar50 >> 5) & 1) * (int)pfVar42[5];
          auVar56._24_4_ = (uint)((byte)(uVar50 >> 6) & 1) * (int)pfVar42[6];
          auVar56._28_4_ = (uint)((byte)(uVar50 >> 7) & 1) * (int)pfVar42[7];
          auVar56._32_4_ = (uint)(bVar31 & 1) * (int)pfVar42[8];
          auVar56._36_4_ = (uint)(bVar31 >> 1 & 1) * (int)pfVar42[9];
          auVar56._40_4_ = (uint)(bVar31 >> 2 & 1) * (int)pfVar42[10];
          auVar56._44_4_ = (uint)(bVar31 >> 3 & 1) * (int)pfVar42[0xb];
          auVar56._48_4_ = (uint)(bVar31 >> 4 & 1) * (int)pfVar42[0xc];
          auVar56._52_4_ = (uint)(bVar31 >> 5 & 1) * (int)pfVar42[0xd];
          auVar56._56_4_ = (uint)(bVar31 >> 6 & 1) * (int)pfVar42[0xe];
          auVar56._60_4_ = (uint)(bVar31 >> 7) * (int)pfVar42[0xf];
          auVar56 = vmulps_avx512f(auVar52,auVar56);
          pfVar42 = x + lVar37 + uVar41;
          bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar50 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar50 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar50 >> 4) & 1);
          bVar19 = (bool)((byte)(uVar50 >> 5) & 1);
          bVar20 = (bool)((byte)(uVar50 >> 6) & 1);
          bVar21 = (bool)((byte)(uVar50 >> 7) & 1);
          bVar22 = (bool)(bVar31 >> 1 & 1);
          bVar23 = (bool)(bVar31 >> 2 & 1);
          bVar24 = (bool)(bVar31 >> 3 & 1);
          bVar25 = (bool)(bVar31 >> 4 & 1);
          bVar26 = (bool)(bVar31 >> 5 & 1);
          bVar27 = (bool)(bVar31 >> 6 & 1);
          *pfVar42 = (float)((uint)(bVar30 & 1) * auVar56._0_4_ |
                            (uint)!(bool)(bVar30 & 1) * (int)*pfVar42);
          pfVar42[1] = (float)((uint)bVar48 * auVar56._4_4_ | (uint)!bVar48 * (int)pfVar42[1]);
          pfVar42[2] = (float)((uint)bVar16 * auVar56._8_4_ | (uint)!bVar16 * (int)pfVar42[2]);
          pfVar42[3] = (float)((uint)bVar17 * auVar56._12_4_ | (uint)!bVar17 * (int)pfVar42[3]);
          pfVar42[4] = (float)((uint)bVar18 * auVar56._16_4_ | (uint)!bVar18 * (int)pfVar42[4]);
          pfVar42[5] = (float)((uint)bVar19 * auVar56._20_4_ | (uint)!bVar19 * (int)pfVar42[5]);
          pfVar42[6] = (float)((uint)bVar20 * auVar56._24_4_ | (uint)!bVar20 * (int)pfVar42[6]);
          pfVar42[7] = (float)((uint)bVar21 * auVar56._28_4_ | (uint)!bVar21 * (int)pfVar42[7]);
          pfVar42[8] = (float)((uint)(bVar31 & 1) * auVar56._32_4_ |
                              (uint)!(bool)(bVar31 & 1) * (int)pfVar42[8]);
          pfVar42[9] = (float)((uint)bVar22 * auVar56._36_4_ | (uint)!bVar22 * (int)pfVar42[9]);
          pfVar42[10] = (float)((uint)bVar23 * auVar56._40_4_ | (uint)!bVar23 * (int)pfVar42[10]);
          pfVar42[0xb] = (float)((uint)bVar24 * auVar56._44_4_ | (uint)!bVar24 * (int)pfVar42[0xb]);
          pfVar42[0xc] = (float)((uint)bVar25 * auVar56._48_4_ | (uint)!bVar25 * (int)pfVar42[0xc]);
          pfVar42[0xd] = (float)((uint)bVar26 * auVar56._52_4_ | (uint)!bVar26 * (int)pfVar42[0xd]);
          pfVar42[0xe] = (float)((uint)bVar27 * auVar56._56_4_ | (uint)!bVar27 * (int)pfVar42[0xe]);
          pfVar42[0xf] = (float)((uint)(bVar31 >> 7) * auVar56._60_4_ |
                                (uint)!(bool)(bVar31 >> 7) * (int)pfVar42[0xf]);
          uVar41 = uVar41 + 0x10;
        } while (uVar44 != uVar41);
      }
      if (pvVar38 == (void *)0x0) {
LAB_0013dee5:
        auVar51 = SUB6416(ZEXT464(0xff800000),0);
        if (0 < (int)n) {
          auVar53 = ZEXT464(0xff800000);
          uVar41 = 0;
          do {
            auVar51 = vmaxss_avx(auVar53._0_16_,ZEXT416((uint)x[uVar41]));
            auVar53 = ZEXT1664(auVar51);
            uVar41 = uVar41 + 1;
          } while (uVar47 != uVar41);
        }
      }
      else if (bVar49) {
        auVar51 = SUB6416(ZEXT464(0xff800000),0);
        if (0 < (int)n) {
          uVar41 = 0;
          do {
            auVar51 = vfmadd213ss_fma(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar36 + uVar41 * 2) * 4)),
                                      auVar62,ZEXT416((uint)x[uVar41]));
            x[uVar41] = auVar51._0_4_;
            uVar41 = uVar41 + 1;
          } while (uVar47 != uVar41);
          goto LAB_0013dee5;
        }
      }
      else {
        auVar51 = SUB6416(ZEXT464(0xff800000),0);
        if (0 < (int)n) {
          uVar41 = 0;
          do {
            auVar51 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar38 + uVar41 * 4)),auVar62,
                                      ZEXT416((uint)x[uVar41]));
            x[uVar41] = auVar51._0_4_;
            uVar41 = uVar41 + 1;
          } while (uVar47 != uVar41);
          goto LAB_0013dee5;
        }
      }
      lVar43 = sVar12 * lVar46;
      pfVar42 = (float *)((long)pvVar13 + lVar43);
      gVar61 = ggml_vec_soft_max_f32(n,pfVar42,x,auVar51._0_4_);
      auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar55 = vmovdqu64_avx512f(auVar4);
      auVar62._0_4_ = (float)(1.0 / gVar61);
      auVar62._4_4_ = (int)((ulong)(1.0 / gVar61) >> 0x20);
      auVar62._8_8_ = 0;
      auVar56 = vbroadcastss_avx512f(auVar62);
      if (0 < (int)uVar45) {
        uVar41 = 0;
        do {
          lVar39 = 0;
          do {
            auVar57 = vmulps_avx512f(auVar56,*(undefined1 (*) [64])((long)pfVar42 + lVar39));
            *(undefined1 (*) [64])((long)pfVar42 + lVar39) = auVar57;
            lVar39 = lVar39 + 0x40;
          } while (lVar39 != 0x100);
          uVar41 = uVar41 + 0x40;
          pfVar42 = pfVar42 + 0x40;
        } while (uVar41 < (n & 0xffffffc0));
      }
      if (uVar45 != n) {
        uVar41 = 0;
        lVar43 = lVar43 + lVar37 * 4;
        do {
          auVar57 = vpbroadcastq_avx512f();
          auVar58 = vporq_avx512f(auVar57,auVar53);
          auVar57 = vporq_avx512f(auVar57,auVar54);
          uVar28 = vpcmpuq_avx512f(auVar57,auVar55,2);
          bVar30 = (byte)uVar28;
          uVar28 = vpcmpuq_avx512f(auVar58,auVar55,2);
          bVar31 = (byte)uVar28;
          uVar50 = CONCAT11(bVar31,bVar30);
          piVar1 = (int *)((long)pvVar13 + uVar41 * 4 + lVar43);
          auVar57._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * piVar1[1];
          auVar57._0_4_ = (uint)(bVar30 & 1) * *piVar1;
          auVar57._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * piVar1[2];
          auVar57._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * piVar1[3];
          auVar57._16_4_ = (uint)((byte)(uVar50 >> 4) & 1) * piVar1[4];
          auVar57._20_4_ = (uint)((byte)(uVar50 >> 5) & 1) * piVar1[5];
          auVar57._24_4_ = (uint)((byte)(uVar50 >> 6) & 1) * piVar1[6];
          auVar57._28_4_ = (uint)((byte)(uVar50 >> 7) & 1) * piVar1[7];
          auVar57._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
          auVar57._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
          auVar57._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
          auVar57._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
          auVar57._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
          auVar57._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
          auVar57._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
          auVar57._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
          auVar57 = vmulps_avx512f(auVar57,auVar56);
          puVar2 = (uint *)((long)pvVar13 + uVar41 * 4 + lVar43);
          bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar50 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar50 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar50 >> 4) & 1);
          bVar19 = (bool)((byte)(uVar50 >> 5) & 1);
          bVar20 = (bool)((byte)(uVar50 >> 6) & 1);
          bVar21 = (bool)((byte)(uVar50 >> 7) & 1);
          bVar22 = (bool)(bVar31 >> 1 & 1);
          bVar23 = (bool)(bVar31 >> 2 & 1);
          bVar24 = (bool)(bVar31 >> 3 & 1);
          bVar25 = (bool)(bVar31 >> 4 & 1);
          bVar26 = (bool)(bVar31 >> 5 & 1);
          bVar27 = (bool)(bVar31 >> 6 & 1);
          *puVar2 = (uint)(bVar30 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar30 & 1) * *puVar2;
          puVar2[1] = (uint)bVar48 * auVar57._4_4_ | (uint)!bVar48 * puVar2[1];
          puVar2[2] = (uint)bVar16 * auVar57._8_4_ | (uint)!bVar16 * puVar2[2];
          puVar2[3] = (uint)bVar17 * auVar57._12_4_ | (uint)!bVar17 * puVar2[3];
          puVar2[4] = (uint)bVar18 * auVar57._16_4_ | (uint)!bVar18 * puVar2[4];
          puVar2[5] = (uint)bVar19 * auVar57._20_4_ | (uint)!bVar19 * puVar2[5];
          puVar2[6] = (uint)bVar20 * auVar57._24_4_ | (uint)!bVar20 * puVar2[6];
          puVar2[7] = (uint)bVar21 * auVar57._28_4_ | (uint)!bVar21 * puVar2[7];
          puVar2[8] = (uint)(bVar31 & 1) * auVar57._32_4_ | (uint)!(bool)(bVar31 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar22 * auVar57._36_4_ | (uint)!bVar22 * puVar2[9];
          puVar2[10] = (uint)bVar23 * auVar57._40_4_ | (uint)!bVar23 * puVar2[10];
          puVar2[0xb] = (uint)bVar24 * auVar57._44_4_ | (uint)!bVar24 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar25 * auVar57._48_4_ | (uint)!bVar25 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar26 * auVar57._52_4_ | (uint)!bVar26 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar27 * auVar57._56_4_ | (uint)!bVar27 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar31 >> 7) * auVar57._60_4_ |
                        (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
          uVar41 = uVar41 + 0x10;
        } while (uVar44 != uVar41);
      }
      lVar46 = lVar46 + 1;
    } while (iVar35 != (int)lVar46);
  }
  return;
}

Assistant:

void ggml_compute_forward_soft_max(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_soft_max_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}